

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-arithm.cpp
# Opt level: O2

void test_arithm<unsigned_char>(uint length,uchar value1,uchar value2,bool allowTrash)

{
  char *pcVar1;
  byte *pbVar2;
  uchar *puVar3;
  undefined8 *puVar4;
  ulong uVar5;
  undefined7 in_register_00000009;
  ulong uVar6;
  uchar *local_98;
  shared_ptr<unsigned_char> pv1;
  shared_ptr<unsigned_char> pv2;
  shared_ptr<unsigned_char> presult;
  
  uVar6 = (ulong)length;
  puVar3 = sse::common::malloc<unsigned_char>(length);
  std::__shared_ptr<unsigned_char,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<unsigned_char,void(*)(unsigned_char*),void>
            ((__shared_ptr<unsigned_char,(__gnu_cxx::_Lock_policy)2> *)&local_98,puVar3,
             sse::common::free<unsigned_char>);
  puVar3 = sse::common::malloc<unsigned_char>(length);
  std::__shared_ptr<unsigned_char,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<unsigned_char,void(*)(unsigned_char*),void>
            ((__shared_ptr<unsigned_char,(__gnu_cxx::_Lock_policy)2> *)
             &pv1.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount,puVar3,
             sse::common::free<unsigned_char>);
  presult.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       (undefined4)CONCAT71(in_register_00000009,allowTrash);
  puVar3 = sse::common::malloc<unsigned_char>(length + 1);
  std::__shared_ptr<unsigned_char,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<unsigned_char,void(*)(unsigned_char*),void>
            ((__shared_ptr<unsigned_char,(__gnu_cxx::_Lock_policy)2> *)
             &pv2.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount,puVar3,
             sse::common::free<unsigned_char>);
  *(undefined1 *)
   ((long)&(pv2.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
           _vptr__Sp_counted_base + uVar6) = 0x7f;
  nosimd::common::set<unsigned_char>(value1,local_98,length);
  nosimd::common::set<unsigned_char>
            (value2,(uchar *)pv1.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi,length);
  uVar5 = 0;
  while (uVar6 != uVar5) {
    if ((local_98[uVar5] != value1) ||
       (puVar3 = (uchar *)((long)&(pv1.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi)->_vptr__Sp_counted_base + uVar5),
       uVar5 = uVar5 + 1, *puVar3 != value2)) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar4 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned char]";
      *(undefined4 *)(puVar4 + 1) = 0x1a;
      *(uint *)((long)puVar4 + 0xc) = length;
      __cxa_throw(puVar4,&Exception::typeinfo,0);
    }
  }
  nosimd::arithmetic::add<unsigned_char>
            (local_98,(uchar *)pv1.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi,
             (uchar *)pv2.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi,length);
  uVar5 = 0;
  while (uVar6 != uVar5) {
    pcVar1 = (char *)((long)&(pv2.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar5);
    uVar5 = uVar5 + 1;
    if (*pcVar1 != (uchar)(value2 + value1)) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar4 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned char]";
      *(undefined4 *)(puVar4 + 1) = 0x22;
      *(uint *)((long)puVar4 + 0xc) = length;
      __cxa_throw(puVar4,&Exception::typeinfo,0);
    }
  }
  nosimd::arithmetic::sub<unsigned_char>
            (local_98,(uchar *)pv1.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi,
             (uchar *)pv2.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi,length);
  uVar5 = 0;
  while (uVar6 != uVar5) {
    pcVar1 = (char *)((long)&(pv2.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar5);
    uVar5 = uVar5 + 1;
    if (*pcVar1 != (uchar)(value1 - value2)) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar4 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned char]";
      *(undefined4 *)(puVar4 + 1) = 0x2a;
      *(uint *)((long)puVar4 + 0xc) = length;
      __cxa_throw(puVar4,&Exception::typeinfo,0);
    }
  }
  nosimd::arithmetic::mul<unsigned_char>
            (local_98,(uchar *)pv1.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi,
             (uchar *)pv2.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi,length);
  uVar5 = 0;
  while (uVar6 != uVar5) {
    pcVar1 = (char *)((long)&(pv2.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar5);
    uVar5 = uVar5 + 1;
    if (*pcVar1 != (uchar)(value2 * value1)) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar4 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned char]";
      *(undefined4 *)(puVar4 + 1) = 0x32;
      *(uint *)((long)puVar4 + 0xc) = length;
      __cxa_throw(puVar4,&Exception::typeinfo,0);
    }
  }
  nosimd::arithmetic::div<unsigned_char>
            (local_98,(uchar *)pv1.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi,
             (uchar *)pv2.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi,length);
  uVar5 = 0;
  while (uVar6 != uVar5) {
    pbVar2 = (byte *)((long)&(pv2.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar5);
    uVar5 = uVar5 + 1;
    if (*pbVar2 != value1 / value2) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar4 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned char]";
      *(undefined4 *)(puVar4 + 1) = 0x3a;
      *(uint *)((long)puVar4 + 0xc) = length;
      __cxa_throw(puVar4,&Exception::typeinfo,0);
    }
  }
  nosimd::arithmetic::addC<unsigned_char>
            (local_98,value2,
             (uchar *)pv2.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi,length);
  uVar5 = 0;
  while (uVar6 != uVar5) {
    pcVar1 = (char *)((long)&(pv2.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar5);
    uVar5 = uVar5 + 1;
    if (*pcVar1 != (uchar)(value2 + value1)) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar4 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned char]";
      *(undefined4 *)(puVar4 + 1) = 0x43;
      *(uint *)((long)puVar4 + 0xc) = length;
      __cxa_throw(puVar4,&Exception::typeinfo,0);
    }
  }
  nosimd::arithmetic::subC<unsigned_char>
            (local_98,value2,
             (uchar *)pv2.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi,length);
  uVar5 = 0;
  while (uVar6 != uVar5) {
    pcVar1 = (char *)((long)&(pv2.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar5);
    uVar5 = uVar5 + 1;
    if (*pcVar1 != (uchar)(value1 - value2)) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar4 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned char]";
      *(undefined4 *)(puVar4 + 1) = 0x4b;
      *(uint *)((long)puVar4 + 0xc) = length;
      __cxa_throw(puVar4,&Exception::typeinfo,0);
    }
  }
  nosimd::arithmetic::subCRev<unsigned_char>
            (local_98,value2,
             (uchar *)pv2.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi,length);
  uVar5 = 0;
  while (uVar6 != uVar5) {
    pcVar1 = (char *)((long)&(pv2.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar5);
    uVar5 = uVar5 + 1;
    if (*pcVar1 != (uchar)(value2 - value1)) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar4 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned char]";
      *(undefined4 *)(puVar4 + 1) = 0x53;
      *(uint *)((long)puVar4 + 0xc) = length;
      __cxa_throw(puVar4,&Exception::typeinfo,0);
    }
  }
  nosimd::arithmetic::mulC<unsigned_char>
            (local_98,value2,
             (uchar *)pv2.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi,length);
  uVar5 = 0;
  while (uVar6 != uVar5) {
    pcVar1 = (char *)((long)&(pv2.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar5);
    uVar5 = uVar5 + 1;
    if (*pcVar1 != (uchar)(value2 * value1)) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar4 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned char]";
      *(undefined4 *)(puVar4 + 1) = 0x5b;
      *(uint *)((long)puVar4 + 0xc) = length;
      __cxa_throw(puVar4,&Exception::typeinfo,0);
    }
  }
  nosimd::arithmetic::divC<unsigned_char>
            (local_98,value2,
             (uchar *)pv2.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi,length);
  uVar5 = 0;
  while (uVar6 != uVar5) {
    pbVar2 = (byte *)((long)&(pv2.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar5);
    uVar5 = uVar5 + 1;
    if (*pbVar2 != value1 / value2) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar4 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned char]";
      *(undefined4 *)(puVar4 + 1) = 99;
      *(uint *)((long)puVar4 + 0xc) = length;
      __cxa_throw(puVar4,&Exception::typeinfo,0);
    }
  }
  nosimd::arithmetic::divCRev<unsigned_char>
            (local_98,value2,
             (uchar *)pv2.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi,length);
  uVar5 = 0;
  while (uVar6 != uVar5) {
    pbVar2 = (byte *)((long)&(pv2.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar5);
    uVar5 = uVar5 + 1;
    if (*pbVar2 != value2 / value1) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar4 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned char]";
      *(undefined4 *)(puVar4 + 1) = 0x6b;
      *(uint *)((long)puVar4 + 0xc) = length;
      __cxa_throw(puVar4,&Exception::typeinfo,0);
    }
  }
  if ((presult.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_1_
       == '\0') &&
     (*(char *)((long)&(pv2.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar6) != '\x7f')) {
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    *puVar4 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned char]";
    *(undefined4 *)(puVar4 + 1) = 0x70;
    *(uint *)((long)puVar4 + 0xc) = length;
    __cxa_throw(puVar4,&Exception::typeinfo,0);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&presult);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pv2);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pv1);
  return;
}

Assistant:

void test_arithm(unsigned length, T value1, T value2, bool allowTrash = false)
{
    auto pv1 = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    auto pv2 = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    auto presult = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    T * v1 = pv1.get();
    T * v2 = pv2.get();
    T * result = presult.get();
    result[length] = 0x7f;

    simd::set(value1, v1, length);
    simd::set(value2, v2, length);

    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(v1[i], value1) || ! equal(v2[i], value2))
            FAIL();
    }

    T r = value1 + value2;
    arithm::add(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 - value2;
    arithm::sub(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 * value2;
    arithm::mul(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 / value2;
    arithm::div(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

#ifndef TEST_FIXED
    r = value1 + value2;
    simd::addC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 - value2;
    simd::subC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (result[i] != r)
            FAIL();
    }

    r = value2 - value1;
    simd::subCRev(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 * value2;
    simd::mulC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (result[i] != r)
            FAIL();
    }

    r = value1 / value2;
    simd::divC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value2 / value1;
    simd::divCRev(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }
#endif // TEST_FIXED

    if (!allowTrash && result[length] != 0x7f)
        FAIL();
}